

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

BOOL __thiscall
Js::SmallSpanSequence::Item
          (SmallSpanSequence *this,int index,SmallSpanSequenceIter *iter,StatementData *data)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  int local_34;
  StatementData *pSStack_30;
  int countOfMissed;
  StatementData *data_local;
  SmallSpanSequenceIter *iter_local;
  SmallSpanSequence *pSStack_18;
  int index_local;
  SmallSpanSequence *this_local;
  
  if ((this->pStatementBuffer == (GrowingUint32HeapArray *)0x0) ||
     (pSStack_30 = data, data_local = (StatementData *)iter, iter_local._4_4_ = index,
     pSStack_18 = this,
     uVar4 = JsUtil::GrowingArray<unsigned_int,_Memory::HeapAllocator>::Count
                       (this->pStatementBuffer), uVar4 <= (uint)index)) {
    this_local._4_4_ = 0;
  }
  else {
    if ((data_local->sourceBegin < 1) || (iter_local._4_4_ < data_local->sourceBegin)) {
      Reset(this,(SmallSpanSequenceIter *)data_local);
    }
    do {
      if (iter_local._4_4_ < data_local->sourceBegin) {
        return 0;
      }
      uVar1 = data_local->sourceBegin;
      uVar4 = JsUtil::GrowingArray<unsigned_int,_Memory::HeapAllocator>::Count
                        (this->pStatementBuffer);
      if (uVar4 <= uVar1) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0x15ca,
                                    "((uint32)iter.accumulatedIndex < pStatementBuffer->Count())",
                                    "(uint32)iter.accumulatedIndex < pStatementBuffer->Count()");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      local_34 = 0;
      BVar5 = GetRangeAt(this,data_local->sourceBegin,(SmallSpanSequenceIter *)data_local,&local_34,
                         pSStack_30);
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0x15cf,"(0)","FALSE");
        if (bVar3) {
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
          return 0;
        }
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      data_local->bytecodeBegin = pSStack_30->sourceBegin;
      data_local[1].sourceBegin = pSStack_30->bytecodeBegin;
      data_local->sourceBegin = data_local->sourceBegin + 1;
      if (local_34 != 0) {
        data_local[1].bytecodeBegin = local_34 + data_local[1].bytecodeBegin;
      }
    } while (data_local->sourceBegin + -1 != iter_local._4_4_);
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

BOOL SmallSpanSequence::Item(int index, SmallSpanSequenceIter &iter, StatementData & data)
    {
        if (!pStatementBuffer || (uint32)index >= pStatementBuffer->Count())
        {
            return FALSE;
        }

        if (iter.accumulatedIndex <= 0 || iter.accumulatedIndex > index)
        {
            Reset(iter);
        }

        while (iter.accumulatedIndex <= index)
        {
            Assert((uint32)iter.accumulatedIndex < pStatementBuffer->Count());

            int countOfMissed = 0;
            if (!GetRangeAt(iter.accumulatedIndex, iter, &countOfMissed, data))
            {
                Assert(FALSE);
                break;
            }

            // We store the next index
            iter.accumulatedSourceBegin = data.sourceBegin;
            iter.accumulatedBytecodeBegin = data.bytecodeBegin;

            iter.accumulatedIndex++;

            if (countOfMissed)
            {
                iter.indexOfActualOffset += countOfMissed;
            }

            if ((iter.accumulatedIndex - 1) == index)
            {
                return TRUE;
            }
        }

        return FALSE;
    }